

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::eval::Prefix_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
eval_internal(Prefix_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this
             ,Dispatch_State *t_ss)

{
  Opers OVar1;
  eval_error *this_00;
  size_t *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  Function_Push_Pop fpp;
  Boxed_Value BVar3;
  string_view t_name;
  Boxed_Value bv;
  undefined1 local_90 [32];
  _func_int **local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  Conversion_Saves local_60;
  anon_class_16_2_73f5579e local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
             &local_70,
             (Dispatch_State *)
             ((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.__align);
  OVar1 = *(Opers *)&t_ss[3].m_stack_holder._M_data;
  if (((OVar1 == bitwise_and) || (OVar1 == invalid)) || (((ulong)local_70[2] & 0x10) == 0)) {
    chaiscript::detail::Dispatch_Engine::new_function_call
              ((Dispatch_Engine *)*in_RDX,(Stack_Holder *)in_RDX[1],(Conversion_Saves *)in_RDX[3]);
    local_90._0_8_ = &local_70;
    local_90._8_8_ = &local_60;
    chaiscript::detail::Dispatch_Engine::save_function_params
              ((Dispatch_Engine *)*in_RDX,(Function_Params *)local_90);
    t_name._M_str = &((t_ss->m_conversions).m_saves._M_data)->enabled;
    t_name._M_len = *in_RDX;
    local_90._0_8_ = &local_70;
    local_90._8_8_ = &local_60;
    chaiscript::detail::Dispatch_Engine::call_function
              ((Dispatch_Engine *)this,t_name,
               (atomic_uint_fast32_t *)(t_ss->m_conversions).m_conversions._M_data,
               (Function_Params *)&t_ss[3].m_conversions,(Type_Conversions_State *)local_90);
    chaiscript::detail::Dispatch_Engine::pop_function_call
              ((Dispatch_Engine *)*in_RDX,(Stack_Holder *)in_RDX[1],(Conversion_Saves *)in_RDX[3]);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    if ((OVar1 - pre_increment < 2) && (((ulong)local_70[2] & 1) != 0)) {
      this_00 = (eval_error *)__cxa_allocate_exception(0x90);
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "Error with prefix operator evaluation: cannot modify constant value.","");
      exception::eval_error::eval_error(this_00,(string *)local_90);
      __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    local_40.t_oper = OVar1;
    local_40.t_lhs = (Boxed_Value *)&local_70;
    BVar3 = Boxed_Number::
            visit<chaiscript::Boxed_Number::oper(chaiscript::Operators::Opers,chaiscript::Boxed_Value_const&)::_lambda(auto:1_const&)_1_&>
                      ((Boxed_Number *)this,(Boxed_Value *)&local_70,&local_40);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    _Var2._M_pi = extraout_RDX_00;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        Boxed_Value bv(this->children[0]->eval(t_ss));

        try {
          // short circuit arithmetic operations
          if (m_oper != Operators::Opers::invalid && m_oper != Operators::Opers::bitwise_and && bv.get_type_info().is_arithmetic()) {
            if ((m_oper == Operators::Opers::pre_increment || m_oper == Operators::Opers::pre_decrement) && bv.is_const()) {
              throw exception::eval_error("Error with prefix operator evaluation: cannot modify constant value.");
            }
            return Boxed_Number::do_oper(m_oper, bv);
          } else {
            chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);
            fpp.save_params(Function_Params{bv});
            return t_ss->call_function(this->text, m_loc, Function_Params{bv}, t_ss.conversions());
          }
        } catch (const exception::dispatch_error &e) {
          throw exception::eval_error("Error with prefix operator evaluation: '" + this->text + "'", e.parameters, e.functions, false, *t_ss);
        }
      }